

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_0::CWriter::WriteUnwindTryCatchStack(CWriter *this,Label *label)

{
  size_type __n;
  ulong uVar1;
  reference t;
  char (*args) [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u;
  Newline *in_R8;
  
  args = (char (*) [16])0x30;
  uVar1 = ((long)(this->try_catch_stack_).
                 super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->try_catch_stack_).
                super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x30;
  __n = label->try_catch_stack_size;
  if (uVar1 < __n) {
    __assert_fail("try_catch_stack_.size() >= label->try_catch_stack_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                  ,0xbdc,
                  "void wabt::(anonymous namespace)::CWriter::WriteUnwindTryCatchStack(const Label *)"
                 );
  }
  if (uVar1 == __n) {
    return;
  }
  t = std::
      vector<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
      ::at(&this->try_catch_stack_,__n);
  (anonymous_namespace)::CWriter::
  Write<char_const(&)[27],std::__cxx11::string_const&,char_const(&)[16],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [27])t,u,args,in_R8);
  return;
}

Assistant:

void CWriter::WriteUnwindTryCatchStack(const Label* label) {
  assert(try_catch_stack_.size() >= label->try_catch_stack_size);

  if (try_catch_stack_.size() != label->try_catch_stack_size) {
    const std::string& name =
        try_catch_stack_.at(label->try_catch_stack_size).name;

    Write("wasm_rt_set_unwind_target(", name, "_outer_target);", Newline());
  }
}